

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O3

Var Js::JsBuiltInEngineInterfaceExtensionObject::EntryJsBuiltIn_RegisterFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  int propertyId;
  ScriptContext *pSVar1;
  JavascriptLibrary *pJVar2;
  code *pcVar3;
  PropertyRecord *this;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  JavascriptString *pJVar7;
  JavascriptString *pstLeft;
  EngineExtensionObjectBase *pEVar8;
  long lVar9;
  PropertyString *pstLeft_00;
  PropertyString *pstCenter;
  ScriptFunction *pSVar10;
  uint uVar11;
  int iVar12;
  PropertyId PVar13;
  DynamicObject *object;
  Type *addr;
  uint in_stack_00000010;
  Var in_stack_00000020;
  Var in_stack_00000028;
  long local_60;
  PropertyRecord *methodPropertyRecord;
  JavascriptString *local_50;
  int local_44;
  DynamicObject *local_40;
  ScriptContext *local_38;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  uVar11 = callInfo._0_4_;
  if (in_stack_00000010 != uVar11) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x11c,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00d2a2c4;
    *puVar6 = 0;
  }
  if ((uVar11 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x11c,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00d2a2c4;
    *puVar6 = 0;
  }
  local_38 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  if ((uVar11 & 0xffffff) == 3) {
    bVar4 = VarIs<Js::ScriptFunction>(in_stack_00000028);
    if (!bVar4) goto LAB_00d29e79;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                  ,0x11c,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar4) goto LAB_00d2a2c4;
      *puVar6 = 0;
    }
LAB_00d29e79:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x11e,
                                "(args.Info.Count == 3 && VarIs<ScriptFunction>(args.Values[2]))",
                                "args.Info.Count == 3 && VarIs<ScriptFunction>(args.Values[2])");
    if (!bVar4) goto LAB_00d2a2c4;
    *puVar6 = 0;
  }
  pSVar1 = local_38;
  pJVar2 = (local_38->super_ScriptContextBase).javascriptLibrary;
  pJVar7 = VarTo<Js::JavascriptString>(in_stack_00000020);
  local_60 = 0;
  local_40 = (DynamicObject *)0x0;
  (*(pJVar7->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x61])(pJVar7,&local_60,0);
  propertyId = *(int *)(local_60 + 8);
  pstLeft = StringCache::GetDot(&pJVar2->stringCache);
  pEVar8 = EngineInterfaceObject::GetEngineExtension
                     ((((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                      super_JavascriptLibraryBase).engineInterfaceObject.ptr,
                      EngineInterfaceExtensionKind_JsBuiltIn);
  iVar12 = *(int *)&pEVar8[2]._vptr_EngineExtensionObjectBase;
  methodPropertyRecord = (PropertyRecord *)pJVar2;
  if (iVar12 == 0) {
    local_40 = (pJVar2->super_JavascriptLibraryBase).arrayPrototype.ptr;
    pstLeft_00 = ScriptContext::GetPropertyString(local_38,0x4f);
    bVar4 = false;
    if (((propertyId == 0x10) || (pstLeft_00 == (PropertyString *)0x0)) ||
       (local_40 == (DynamicObject *)0x0)) goto LAB_00d29fc3;
LAB_00d2a046:
    pstCenter = ScriptContext::GetPropertyString(local_38,0x124);
    pstLeft = JavascriptString::Concat3(pstLeft,&pstCenter->super_JavascriptString,pstLeft);
  }
  else {
    if (iVar12 == 1) {
      PVar13 = 0xd7;
      lVar9 = 0x1b8;
    }
    else {
      if (iVar12 != 2) {
        bVar4 = false;
        pstLeft_00 = (PropertyString *)0x0;
        goto LAB_00d29fc3;
      }
      PVar13 = 0x111;
      lVar9 = 0xc0;
    }
    local_40 = *(DynamicObject **)
                ((long)&(pJVar2->super_JavascriptLibraryBase).super_FinalizableObject.
                        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar9);
    pstLeft_00 = ScriptContext::GetPropertyString(local_38,PVar13);
    bVar4 = true;
    if (((propertyId == 0x10) || (pstLeft_00 == (PropertyString *)0x0)) ||
       (local_40 == (DynamicObject *)0x0)) {
LAB_00d29fc3:
      AssertCount = AssertCount + 1;
      local_50 = pJVar7;
      local_44 = iVar12;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                  ,0x13c,
                                  "(methodString && classPropString && installTarget && methodPropID != PropertyIds::_none)"
                                  ,
                                  "methodString && classPropString && installTarget && methodPropID != PropertyIds::_none"
                                 );
      if (!bVar5) {
LAB_00d2a2c4:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
      pJVar7 = local_50;
      iVar12 = local_44;
      if (!bVar4) goto LAB_00d2a046;
    }
  }
  pJVar7 = JavascriptString::Concat3(&pstLeft_00->super_JavascriptString,pstLeft,pJVar7);
  pSVar10 = UnsafeVarTo<Js::ScriptFunction>(in_stack_00000028);
  pSVar10 = EngineInterfaceObject::CreateLibraryCodeScriptFunction(pSVar10,pJVar7,false,true,true);
  this = methodPropertyRecord;
  JavascriptLibrary::AddMember
            ((JavascriptLibrary *)methodPropertyRecord,local_40,propertyId,pSVar10);
  if (iVar12 == 1) {
    if (propertyId == 0x2a) {
      Memory::Recycler::WBSetBit((char *)&this[0x33].pid);
      *(ScriptFunction **)&this[0x33].pid = pSVar10;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&this[0x33].pid);
      object = (((((local_38->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).engineInterfaceObject.ptr)->commonNativeInterfaces).
               ptr;
      PVar13 = 0x288;
    }
    else {
      if (propertyId != 0xfe) goto LAB_00d2a2ad;
      Memory::Recycler::WBSetBit(&this[0x33].isNumeric);
      *(ScriptFunction **)&this[0x33].isNumeric = pSVar10;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&this[0x33].isNumeric);
      object = (((((local_38->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).engineInterfaceObject.ptr)->commonNativeInterfaces).
               ptr;
      PVar13 = 0x289;
    }
  }
  else {
    if (iVar12 != 0) goto LAB_00d2a2ad;
    if (propertyId < 0xb9) {
      if (propertyId == 0x7a) {
        addr = (Type *)&this[0x32].pid;
        Memory::Recycler::WBSetBit(addr);
        *(ScriptFunction **)&this[0x32].pid = pSVar10;
LAB_00d2a246:
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        goto LAB_00d2a2ad;
      }
      if (propertyId == 0x89) {
        object = (((((local_38->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).engineInterfaceObject.ptr)->commonNativeInterfaces).
                 ptr;
        PVar13 = 0x284;
      }
      else {
        if (propertyId != 0x93) goto LAB_00d2a2ad;
        object = (((((local_38->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).engineInterfaceObject.ptr)->commonNativeInterfaces).
                 ptr;
        PVar13 = 0x285;
      }
    }
    else if (propertyId < 300) {
      if (propertyId != 0xb9) {
        if (propertyId != 0xcf) goto LAB_00d2a2ad;
        addr = &this[0x31].isNumeric;
        Memory::Recycler::WBSetBit(addr);
        *(ScriptFunction **)&this[0x31].isNumeric = pSVar10;
        goto LAB_00d2a246;
      }
      PVar13 = 0x286;
      object = (((((local_38->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).engineInterfaceObject.ptr)->commonNativeInterfaces).
               ptr;
    }
    else if (propertyId == 300) {
      object = (((((local_38->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).engineInterfaceObject.ptr)->commonNativeInterfaces).
               ptr;
      PVar13 = 0x287;
    }
    else {
      if (propertyId != 399) goto LAB_00d2a2ad;
      Memory::Recycler::WBSetBit((char *)&this[0xce].pid);
      *(ScriptFunction **)&this[0xce].pid = pSVar10;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&this[0xce].pid);
      PVar13 = 0x14;
      object = local_40;
    }
  }
  JavascriptLibrary::AddMember((JavascriptLibrary *)this,object,PVar13,pSVar10);
LAB_00d2a2ad:
  return *(Var *)&this[0x2c].isNumeric;
}

Assistant:

Var JsBuiltInEngineInterfaceExtensionObject::EntryJsBuiltIn_RegisterFunction(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

        AssertOrFailFast(args.Info.Count == 3 && VarIs<ScriptFunction>(args.Values[2]));

        JavascriptLibrary * library = scriptContext->GetLibrary();

        // process function name and get property ID
        JavascriptString* methodString = VarTo<JavascriptString>(args.Values[1]);
        PropertyRecord* methodPropertyRecord = nullptr;
        methodString->GetPropertyRecord((PropertyRecord const **) &methodPropertyRecord, false);
        PropertyId methodPropID = methodPropertyRecord->GetPropertyId();

        DynamicObject *installTarget = nullptr;
        bool isStatic = false;
        PropertyString *classPropString = nullptr;
        JavascriptString *fullName = nullptr;
        JavascriptString *dot = library->GetDotString();
        JsBuiltInFile current = (static_cast<JsBuiltInEngineInterfaceExtensionObject*>(scriptContext->GetLibrary()
            ->GetEngineInterfaceObject()->GetEngineExtension(EngineInterfaceExtensionKind_JsBuiltIn)))->current;

        // determine what object this function is being added too
        switch (current)
        {
            #define file(class, type, obj) \
            case class##_##type: \
                isStatic = static_cast<bool>(IsTypeStatic::##type); \
                installTarget = library->Get##obj##(); \
                classPropString = scriptContext->GetPropertyString(PropertyIds::class); \
                break;
            JsBuiltIns(file)
        }

        Assert(methodString && classPropString && installTarget && methodPropID != PropertyIds::_none);

        if (isStatic)
        {
            fullName = JavascriptString::Concat3(classPropString, dot, methodString);
        }
        else
        {
            JavascriptString *dotPrototypeDot = JavascriptString::Concat3(dot, scriptContext->GetPropertyString(PropertyIds::prototype), dot);
            fullName = JavascriptString::Concat3(classPropString, dotPrototypeDot, methodString);
        }

        ScriptFunction *func = EngineInterfaceObject::CreateLibraryCodeScriptFunction(
            UnsafeVarTo<ScriptFunction>(args.Values[2]),
            fullName,
            false /* isConstructor */,
            true /* isJsBuiltIn */,
            true /* isPublic */
        );

        library->AddMember(installTarget, methodPropID, func);

        // Make function available to other internal facilities that need it
        // applicable for specific functions only - this may need review upon moving other functions into JsBuiltins
        if (current == JsBuiltInFile::Array_prototype)
        {
            switch (methodPropID)
            {
                case PropertyIds::entries:
                    library->arrayPrototypeEntriesFunction = func;
                    break;
                case PropertyIds::values:
                    library->arrayPrototypeValuesFunction = func;
                    library->AddMember(installTarget, PropertyIds::_symbolIterator, func);
                    break;
                case PropertyIds::keys:
                    library->arrayPrototypeKeysFunction = func;
                    break;
                case PropertyIds::forEach:
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInArray_prototype_forEach, func);
                    break;
                case PropertyIds::filter:
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInArray_prototype_filter, func);
                    break;
                case PropertyIds::indexOf:
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInArray_prototype_indexOf, func);
                    break;
                case PropertyIds::reduce:
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInArray_prototype_reduce, func);
                    break;
            }
        }
        else if (current == JsBuiltInFile::Math_object)
        {
            switch (methodPropID)
            {
                case PropertyIds::max:
                    library->mathMax = func;
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInMath_object_max, func);
                    break;
                case PropertyIds::min:
                    library->mathMin = func;
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInMath_object_min, func);
                    break;
            }
        }
        //Don't need to return anything
        return library->GetUndefined();
    }